

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Box.cpp
# Opt level: O2

Vector * __thiscall Box::find_normal(Vector *__return_storage_ptr__,Box *this,Vector *p)

{
  int iVar1;
  int iVar2;
  long lVar3;
  Vector *pVVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  dVar5 = INFINITY;
  iVar2 = 0;
  pVVar4 = this->n;
  for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
    dVar6 = operator&(p,pVVar4);
    dVar8 = ABS(this->d1[lVar3] + dVar6);
    dVar7 = ABS(dVar6 + this->d2[lVar3]);
    dVar6 = dVar8;
    if (dVar5 <= dVar8) {
      dVar6 = dVar5;
    }
    iVar1 = (int)lVar3;
    if (dVar6 <= dVar7) {
      iVar1 = iVar2;
    }
    iVar2 = iVar1;
    if (dVar8 < dVar5) {
      iVar2 = (int)lVar3;
    }
    dVar5 = dVar7;
    if (dVar6 <= dVar7) {
      dVar5 = dVar6;
    }
    pVVar4 = pVVar4 + 1;
  }
  pVVar4 = this->n + iVar2;
  dVar6 = pVVar4->x;
  dVar7 = pVVar4->y;
  __return_storage_ptr__->x = dVar6;
  __return_storage_ptr__->y = dVar7;
  dVar5 = this->n[iVar2].z;
  __return_storage_ptr__->z = dVar5;
  if ((p->z - (this->center).z) * dVar5 +
      (p->x - (this->center).x) * dVar6 + dVar7 * (p->y - (this->center).y) < 0.0) {
    __return_storage_ptr__->x = -dVar6;
    __return_storage_ptr__->y = -dVar7;
    __return_storage_ptr__->z = -dVar5;
  }
  return __return_storage_ptr__;
}

Assistant:

Vector Box::find_normal( Vector& p )
{
    double MinDist = INFINITY;
    int index = 0;
    double d,Dist1,Dist2;
    Vector normal;
    int i;

    for( i = 0; i < 3; i++ )
    {
        d = p & n[i];
        Dist1 = fabs(d + d1[i]);
        Dist2 = fabs(d + d2[i]);

        if( Dist1 < MinDist )
        {
            MinDist = Dist1;
            index = i;
        }
        if( Dist2 < MinDist )
        {
            MinDist = Dist2;
            index = i;
        }
    }
    normal = n[index];
    if( ((p - center) & normal) < 0.0 )
        normal = -normal;

    return normal;
}